

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O1

timeval __thiscall absl::lts_20250127::ToTimeval(lts_20250127 *this,Duration d)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  timeval tVar5;
  
  uVar3 = d.rep_hi_.lo_;
  if (uVar3 == 0xffffffff) {
    bVar4 = -1 < (long)this;
    this = (lts_20250127 *)0x8000000000000000;
    if (bVar4) {
      this = (lts_20250127 *)0x7fffffffffffffff;
    }
    uVar2 = 999999999;
    if (!bVar4) {
      uVar2 = 0;
    }
  }
  else {
    uVar1 = uVar3;
    if (((long)this < 0) && (uVar1 = uVar3 + 3, 3999999999 < uVar1)) {
      this = this + 1;
      uVar1 = uVar3 + 0x1194d803;
    }
    uVar2 = (ulong)(uVar1 >> 2);
  }
  if ((long)this < 0) {
    if (uVar2 < 0x3b9ac619) {
      uVar2 = uVar2 + 999;
    }
    else {
      this = this + 1;
      uVar2 = uVar2 - 0x3b9ac619;
    }
  }
  tVar5.tv_usec = uVar2 / 1000 & 0xffffffff;
  tVar5.tv_sec = (__time_t)this;
  return tVar5;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool IsInfiniteDuration(Duration d) {
  return GetRepLo(d) == ~uint32_t{0};
}